

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorConicGradient::ReleaseElementData
          (DecoratorConicGradient *this,DecoratorDataHandle handle)

{
  PoolNode *pPVar1;
  PoolNode *pPVar2;
  code *pcVar3;
  bool bVar4;
  Pool<Rml::ShaderElementData> *pPVar5;
  PoolNode **ppPVar6;
  
  pPVar5 = GetShaderElementDataPool();
  pPVar5->num_allocated_objects = pPVar5->num_allocated_objects + -1;
  CompiledShader::Release((CompiledShader *)(handle + 0x10));
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)handle);
  pPVar1 = *(PoolNode **)(handle + 0x20);
  pPVar2 = *(PoolNode **)(handle + 0x28);
  if (pPVar1 == (PoolNode *)0x0) {
    ppPVar6 = &pPVar5->first_allocated_node;
    if (pPVar5->first_allocated_node != (PoolNode *)handle) {
      bVar4 = Assert("RMLUI_ASSERT(first_allocated_node == object)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Pool.inl"
                     ,0xa5);
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
    }
  }
  else {
    ppPVar6 = &pPVar1->next;
  }
  *ppPVar6 = pPVar2;
  if (pPVar2 != (PoolNode *)0x0) {
    pPVar2->previous = pPVar1;
  }
  pPVar1 = pPVar5->first_free_node;
  *(undefined8 *)(handle + 0x20) = 0;
  *(PoolNode **)(handle + 0x28) = pPVar1;
  pPVar5->first_free_node = (PoolNode *)handle;
  return;
}

Assistant:

void DecoratorConicGradient::ReleaseElementData(DecoratorDataHandle handle) const
{
	ShaderElementData* element_data = reinterpret_cast<ShaderElementData*>(handle);
	GetShaderElementDataPool().DestroyAndDeallocate(element_data);
}